

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_OverlapSequenceChecks::_Run(_Test_OverlapSequenceChecks *this)

{
  bool bVar1;
  Tester local_1b8;
  
  FindFileTest::Add(&this->super_FindFileTest,"200","200",5000,3000);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x97;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"199","199");
  test::Tester::Is(&local_1b8,!bVar1,"!Overlaps(\"199\", \"199\")");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x98;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"201","300");
  test::Tester::Is(&local_1b8,!bVar1,"!Overlaps(\"201\", \"300\")");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x99;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","200");
  test::Tester::Is(&local_1b8,bVar1,"Overlaps(\"200\", \"200\")");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x9a;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"190","200");
  test::Tester::Is(&local_1b8,bVar1,"Overlaps(\"190\", \"200\")");
  test::Tester::~Tester(&local_1b8);
  local_1b8.ok_ = true;
  local_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
  ;
  local_1b8.line_ = 0x9b;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.ss_);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","210");
  test::Tester::Is(&local_1b8,bVar1,"Overlaps(\"200\", \"210\")");
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}